

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_getCanonicalPendingInstanceType(sysbvm_context_t *context,sysbvm_tuple_t type)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  
  _Var1 = sysbvm_tuple_isKindOf(context,type,(context->roots).referenceType);
  if (_Var1) {
    sVar2 = sysbvm_type_getCanonicalPendingInstanceType(context,*(sysbvm_tuple_t *)(type + 0xf8));
    sVar2 = sysbvm_type_createReferenceType(context,sVar2,*(sysbvm_tuple_t *)(type + 0x100));
    return sVar2;
  }
  _Var1 = sysbvm_type_isDirectSubtypeOf(type,(context->roots).metatypeType);
  if ((!_Var1) || (sVar2 = *(sysbvm_tuple_t *)(type + 0xf8), sVar2 == 0)) {
    sVar2 = (context->roots).anyValueType;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_getCanonicalPendingInstanceType(sysbvm_context_t *context, sysbvm_tuple_t type)
{
    // FIXME: Check the validity of this condition.
    if(sysbvm_tuple_isKindOf(context, type, context->roots.referenceType))
    {
        sysbvm_pointerLikeType_t *pointerLikeType = (sysbvm_pointerLikeType_t*)type;
        return sysbvm_type_createReferenceType(context, sysbvm_type_getCanonicalPendingInstanceType(context, pointerLikeType->baseType), pointerLikeType->addressSpace);
    }

    if(sysbvm_type_isDirectSubtypeOf(type, context->roots.metatypeType))
    {
        sysbvm_tuple_t thisType = ((sysbvm_metatype_t*)type)->thisType;
        if(thisType)
            return thisType;
    }
    
    return context->roots.anyValueType;
}